

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylstrmatrix.cpp
# Opt level: O2

TPZMatrix<std::complex<double>_> * __thiscall
TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>::Create
          (TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
           *this)

{
  TPZMatrix<std::complex<double>_> *pTVar1;
  TPZVec<long> skyline;
  TPZVec<long> local_28;
  
  local_28._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  local_28.fNAlloc = 0;
  local_28.fStore = (long *)0x0;
  local_28.fNElements = 0;
  (**(code **)(*(long *)(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.
                        fMesh + 0xe8))();
  TPZEquationFilter::FilterSkyline
            (&(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.
              fEquationFilter,&local_28);
  pTVar1 = (TPZMatrix<std::complex<double>_> *)
           (**(code **)(*(long *)&(this->super_TPZStructMatrixT<std::complex<double>_>).
                                  super_TPZStructMatrix + 0x58))
                     (this,(&(this->super_TPZStructMatrixT<std::complex<double>_>).
                             super_TPZStructMatrix.fEquationFilter.fNumEq)
                           [(ulong)(this->super_TPZStructMatrixT<std::complex<double>_>).
                                   super_TPZStructMatrix.fEquationFilter.fIsActive * 4],&local_28);
  TPZVec<long>::~TPZVec(&local_28);
  return pTVar1;
}

Assistant:

TPZMatrix<TVar> * TPZSkylineStructMatrix<TVar,TPar>::Create(){
    TPZVec<int64_t> skyline;
    this->fMesh->Skyline(skyline);
    this->fEquationFilter.FilterSkyline(skyline);
    int64_t neq = this->fEquationFilter.NActiveEquations();
//    std::cout << skyline << std::endl;
    return this->ReallyCreate(neq,skyline);//new TPZSkylMatrix<TVar>(neq,skyline);
}